

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolicyPoolPartialJPolValPair.cpp
# Opt level: O1

string * __thiscall
PolicyPoolPartialJPolValPair::SoftPrint_abi_cxx11_
          (string *__return_storage_ptr__,PolicyPoolPartialJPolValPair *this)

{
  int *piVar1;
  sp_counted_base *psVar2;
  priority_queue<boost::shared_ptr<PartialJPDPValuePair>,_std::vector<boost::shared_ptr<PartialJPDPValuePair>,_std::allocator<boost::shared_ptr<PartialJPDPValuePair>_>_>,_std::less<boost::shared_ptr<PartialJPDPValuePair>_>_>
  *this_00;
  pointer psVar3;
  ostream *poVar4;
  stringstream ss;
  long *local_1e8;
  long local_1e0;
  long local_1d8 [2];
  element_type *local_1c8;
  shared_count sStack_1c0;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  this_00 = (priority_queue<boost::shared_ptr<PartialJPDPValuePair>,_std::vector<boost::shared_ptr<PartialJPDPValuePair>,_std::allocator<boost::shared_ptr<PartialJPDPValuePair>_>_>,_std::less<boost::shared_ptr<PartialJPDPValuePair>_>_>
             *)operator_new(0x20);
  std::
  vector<boost::shared_ptr<PartialJPDPValuePair>,_std::allocator<boost::shared_ptr<PartialJPDPValuePair>_>_>
  ::vector((vector<boost::shared_ptr<PartialJPDPValuePair>,_std::allocator<boost::shared_ptr<PartialJPDPValuePair>_>_>
            *)this_00,&this->_m_jpvpQueue_p->c);
  psVar3 = (this_00->c).
           super__Vector_base<boost::shared_ptr<PartialJPDPValuePair>,_std::allocator<boost::shared_ptr<PartialJPDPValuePair>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this_00->c).
      super__Vector_base<boost::shared_ptr<PartialJPDPValuePair>,_std::allocator<boost::shared_ptr<PartialJPDPValuePair>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != psVar3) {
    do {
      psVar2 = (psVar3->pn).pi_;
      local_1c8 = psVar3->px;
      sStack_1c0.pi_ = (psVar3->pn).pi_;
      if (psVar2 != (sp_counted_base *)0x0) {
        LOCK();
        piVar1 = &psVar2->use_count_;
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      (*(local_1c8->super_PartialJointPolicyValuePair).super_PartialPolicyPoolItemInterface.
        _vptr_PartialPolicyPoolItemInterface[0xf])(&local_1e8);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,(char *)local_1e8,local_1e0);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      if (local_1e8 != local_1d8) {
        operator_delete(local_1e8,local_1d8[0] + 1);
      }
      std::
      priority_queue<boost::shared_ptr<PartialJPDPValuePair>,_std::vector<boost::shared_ptr<PartialJPDPValuePair>,_std::allocator<boost::shared_ptr<PartialJPDPValuePair>_>_>,_std::less<boost::shared_ptr<PartialJPDPValuePair>_>_>
      ::pop(this_00);
      boost::detail::shared_count::~shared_count(&sStack_1c0);
      psVar3 = (this_00->c).
               super__Vector_base<boost::shared_ptr<PartialJPDPValuePair>,_std::allocator<boost::shared_ptr<PartialJPDPValuePair>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while ((this_00->c).
             super__Vector_base<boost::shared_ptr<PartialJPDPValuePair>,_std::allocator<boost::shared_ptr<PartialJPDPValuePair>_>_>
             ._M_impl.super__Vector_impl_data._M_finish != psVar3);
  }
  std::
  vector<boost::shared_ptr<PartialJPDPValuePair>,_std::allocator<boost::shared_ptr<PartialJPDPValuePair>_>_>
  ::~vector((vector<boost::shared_ptr<PartialJPDPValuePair>,_std::allocator<boost::shared_ptr<PartialJPDPValuePair>_>_>
             *)this_00);
  operator_delete(this_00,0x20);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

string PolicyPoolPartialJPolValPair::SoftPrint() const
{
    stringstream ss;
    priority_queue<PartialJPDPValuePair_sharedPtr> *new_jpvpQueue_p = 
        new priority_queue<PartialJPDPValuePair_sharedPtr>(*_m_jpvpQueue_p);

    while(new_jpvpQueue_p->size() > 0)
    {
        PartialJPDPValuePair_sharedPtr jpvp = new_jpvpQueue_p->top();
        ss << jpvp->SoftPrint() << endl;

        new_jpvpQueue_p->pop();    
    }

    delete new_jpvpQueue_p;
    return(ss.str());
}